

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

aom_codec_err_t av1_copy_reference_dec(AV1Decoder *pbi,int idx,YV12_BUFFER_CONFIG *sd)

{
  RefCntBuffer *pRVar1;
  aom_codec_err_t aVar2;
  YV12_BUFFER_CONFIG *src_bc;
  
  if ((uint)idx < 8) {
    pRVar1 = (pbi->common).ref_frame_map[(uint)idx];
    src_bc = &pRVar1->buf;
    if (pRVar1 == (RefCntBuffer *)0x0) {
      src_bc = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  else {
    src_bc = (YV12_BUFFER_CONFIG *)0x0;
  }
  if (src_bc == (YV12_BUFFER_CONFIG *)0x0) {
    aVar2 = AOM_CODEC_ERROR;
    aom_internal_error(&pbi->error,AOM_CODEC_ERROR,"No reference frame");
  }
  else {
    if (((((src_bc->field_1).field_0.y_height == (sd->field_1).field_0.y_height) &&
         ((src_bc->field_0).field_0.y_width == (sd->field_0).field_0.y_width)) &&
        ((src_bc->field_1).field_0.uv_height == (sd->field_1).field_0.uv_height)) &&
       ((src_bc->field_0).field_0.uv_width == (sd->field_0).field_0.uv_width)) {
      aom_yv12_copy_frame_c
                (src_bc,sd,(uint)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1);
    }
    else {
      aom_internal_error(&pbi->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
    }
    aVar2 = (pbi->error).error_code;
  }
  return aVar2;
}

Assistant:

aom_codec_err_t av1_copy_reference_dec(AV1Decoder *pbi, int idx,
                                       YV12_BUFFER_CONFIG *sd) {
  AV1_COMMON *cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);

  const YV12_BUFFER_CONFIG *const cfg = get_ref_frame(cm, idx);
  if (cfg == NULL) {
    aom_internal_error(&pbi->error, AOM_CODEC_ERROR, "No reference frame");
    return AOM_CODEC_ERROR;
  }
  if (!equal_dimensions(cfg, sd))
    aom_internal_error(&pbi->error, AOM_CODEC_ERROR,
                       "Incorrect buffer dimensions");
  else
    aom_yv12_copy_frame(cfg, sd, num_planes);

  return pbi->error.error_code;
}